

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O1

void __thiscall chrono::ChLinkMask::ChLinkMask(ChLinkMask *this,ChLinkMask *other)

{
  ChConstraintTwoBodies *pCVar1;
  long lVar2;
  
  this->_vptr_ChLinkMask = (_func_int **)&PTR__ChLinkMask_00b3d820;
  (this->constraints).
  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->constraints).
  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->constraints).
  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nconstr = other->nconstr;
  std::vector<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>::
  resize(&this->constraints,(long)other->nconstr);
  if (0 < this->nconstr) {
    lVar2 = 0;
    do {
      pCVar1 = (ChConstraintTwoBodies *)
               (**(code **)((long)((other->constraints).
                                   super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar2]->
                                  super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint +
                           0x10))();
      (this->constraints).
      super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar2] = pCVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 < this->nconstr);
  }
  return;
}

Assistant:

ChLinkMask::ChLinkMask(const ChLinkMask& other) {
    nconstr = other.nconstr;
    constraints.resize(other.nconstr);
    for (int i = 0; i < nconstr; i++) {
        constraints[i] = other.constraints[i]->Clone();
    }
}